

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readam.c
# Opt level: O0

int it_riff_am_process_sample(IT_SAMPLE *sample,DUMBFILE *f,int len,int ver)

{
  int32 iVar1;
  int iVar2;
  int iVar3;
  int32 iVar4;
  int32 iVar5;
  int32 iVar6;
  int32 iVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  int in_ECX;
  int in_EDX;
  DUMBFILE *in_RSI;
  long in_RDI;
  int32 start;
  int sample_rate;
  int loop_end;
  int loop_start;
  int length_bytes;
  int length;
  int flags;
  int default_volume;
  int default_pan;
  int header_length;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint local_30;
  int32 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int32 iVar11;
  int local_1c;
  int local_4;
  
  iVar1 = dumbfile_pos(in_RSI);
  if (in_ECX == 0) {
    if (in_EDX < 0x38) {
      return -1;
    }
    iVar11 = 0x38;
    dumbfile_getnc((char *)CONCAT44(0x38,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4,
                   (DUMBFILE *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    *(undefined1 *)(in_RDI + 0x1c) = 0;
    iVar2 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,iVar1));
    iVar3 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,iVar1));
    local_30 = dumbfile_igetw((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,iVar1));
    iVar4 = dumbfile_igetl((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,iVar1));
    iVar5 = dumbfile_igetl((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,iVar1));
    iVar6 = dumbfile_igetl((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,iVar1));
    iVar7 = dumbfile_igetl((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,iVar1));
    local_1c = in_EDX;
  }
  else {
    if (in_EDX < 4) {
      return -1;
    }
    iVar11 = dumbfile_igetl((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,iVar1));
    if (iVar11 < 0x40) {
      return -1;
    }
    if (in_EDX < iVar11 + 4) {
      return -1;
    }
    iVar1 = iVar1 + 4;
    local_1c = in_EDX + -4;
    dumbfile_getnc((char *)CONCAT44(iVar11,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4,
                   (DUMBFILE *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    iVar2 = dumbfile_igetw((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,iVar1));
    iVar3 = dumbfile_igetw((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,iVar1));
    local_30 = dumbfile_igetw((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,iVar1));
    dumbfile_skip((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar4 = dumbfile_igetl((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,iVar1));
    iVar5 = dumbfile_igetl((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,iVar1));
    iVar6 = dumbfile_igetl((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,iVar1));
    iVar7 = dumbfile_igetl((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,iVar1));
    if ((0x7fff < iVar2) || (0x7fff < iVar3)) {
      return -1;
    }
    iVar2 = (iVar2 << 6) / 0x7fff;
    iVar3 = (iVar3 << 6) / 0x7fff;
  }
  if (iVar4 == 0) {
    *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) & 0xfe;
    local_4 = 0;
  }
  else if ((local_30 & 0xffff7f43) == 0) {
    if (local_1c < (iVar4 << (sbyte)((int)(local_30 & 4) >> 2)) + iVar11) {
      local_4 = -1;
    }
    else {
      *(undefined1 *)(in_RDI + 0x32) = 0;
      if ((local_30 & 0x80) != 0) {
        *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) | 1;
      }
      if ((local_30 & 4) != 0) {
        *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) | 2;
      }
      *(int32 *)(in_RDI + 0x38) = iVar4;
      *(int32 *)(in_RDI + 0x3c) = iVar5;
      *(int32 *)(in_RDI + 0x40) = iVar6;
      *(int32 *)(in_RDI + 0x44) = iVar7;
      *(char *)(in_RDI + 0x34) = (char)iVar3;
      *(byte *)(in_RDI + 0x35) = (byte)iVar2 | (byte)((local_30 & 0x20) << 2);
      *(undefined1 *)(in_RDI + 0x23) = 0;
      *(undefined1 *)(in_RDI + 0x33) = 0x40;
      *(undefined1 *)(in_RDI + 0x50) = 0;
      *(undefined1 *)(in_RDI + 0x51) = 0;
      *(undefined1 *)(in_RDI + 0x52) = 0;
      *(undefined1 *)(in_RDI + 0x53) = 0;
      *(undefined2 *)(in_RDI + 0x54) = 0;
      *(undefined4 *)(in_RDI + 0x60) = 0xffffffff;
      if ((((local_30 & 8) != 0) && (*(uint *)(in_RDI + 0x40) <= *(uint *)(in_RDI + 0x38))) &&
         (*(uint *)(in_RDI + 0x3c) < *(uint *)(in_RDI + 0x40))) {
        *(undefined4 *)(in_RDI + 0x38) = *(undefined4 *)(in_RDI + 0x40);
        *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) | 0x10;
        if ((local_30 & 0x10) != 0) {
          *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) | 0x40;
        }
      }
      iVar8 = *(int *)(in_RDI + 0x38) << (sbyte)((int)(local_30 & 4) >> 2);
      pvVar10 = malloc((long)iVar8);
      *(void **)(in_RDI + 0x58) = pvVar10;
      if (*(long *)(in_RDI + 0x58) == 0) {
        local_4 = -1;
      }
      else {
        iVar9 = dumbfile_seek((DUMBFILE *)CONCAT44(iVar5,iVar6),CONCAT44(iVar7,iVar1),0);
        if (iVar9 == 0) {
          dumbfile_getnc((char *)CONCAT44(iVar11,iVar2),iVar3,(DUMBFILE *)CONCAT44(iVar4,iVar8));
          local_4 = 0;
        }
        else {
          local_4 = -1;
        }
      }
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int it_riff_am_process_sample( IT_SAMPLE * sample, DUMBFILE * f, int len, int ver )
{
	int header_length;
	int default_pan;
	int default_volume;
	int flags;
	int length;
	int length_bytes;
	int loop_start;
	int loop_end;
    int sample_rate;

    int32 start = dumbfile_pos( f );

	if ( ver == 0 )
    {
		if ( len < 0x38 )
			return -1;

		header_length = 0x38;

        dumbfile_getnc( (char *) sample->name, 28, f );
		sample->name[ 28 ] = 0;

        default_pan = dumbfile_getc( f );
        default_volume = dumbfile_getc( f );
        flags = dumbfile_igetw( f );
        length = dumbfile_igetl( f );
        loop_start = dumbfile_igetl( f );
        loop_end = dumbfile_igetl( f );
        sample_rate = dumbfile_igetl( f );
	}
	else
	{
		if (len < 4) return -1;

        header_length = dumbfile_igetl( f );
		if ( header_length < 0x40 )
			return -1;
		if ( header_length + 4 > len )
			return -1;

        start += 4;
		len -= 4;

        dumbfile_getnc( (char *) sample->name, 32, f );

        default_pan = dumbfile_igetw( f );
        default_volume = dumbfile_igetw( f );
        flags = dumbfile_igetw( f );
        dumbfile_skip( f, 2 );
        length = dumbfile_igetl( f );
        loop_start = dumbfile_igetl( f );
        loop_end = dumbfile_igetl( f );
        sample_rate = dumbfile_igetl( f );

		if ( default_pan > 0x7FFF || default_volume > 0x7FFF )
			return -1;

		default_pan = default_pan * 64 / 32767;
		default_volume = default_volume * 64 / 32767;
	}

	if ( ! length ) {
		sample->flags &= ~IT_SAMPLE_EXISTS;
		return 0;
	}

	if ( flags & ~( 0x8000 | 0x80 | 0x20 | 0x10 | 0x08 | 0x04 ) )
		return -1;

	length_bytes = length << ( ( flags & 0x04 ) >> 2 );

	if ( length_bytes + header_length > len )
		return -1;

	sample->flags = 0;

	if ( flags & 0x80 ) sample->flags |= IT_SAMPLE_EXISTS;
	if ( flags & 0x04 ) sample->flags |= IT_SAMPLE_16BIT;

	sample->length = length;
	sample->loop_start = loop_start;
	sample->loop_end = loop_end;
	sample->C5_speed = sample_rate;
	sample->default_volume = default_volume;
	sample->default_pan = default_pan | ( ( flags & 0x20 ) << 2 );
	sample->filename[0] = 0;
	sample->global_volume = 64;
	sample->vibrato_speed = 0;
	sample->vibrato_depth = 0;
	sample->vibrato_rate = 0;
	sample->vibrato_waveform = IT_VIBRATO_SINE;
	sample->finetune = 0;
	sample->max_resampling_quality = -1;

	if ( flags & 0x08 )
	{
		if (((unsigned int)sample->loop_end <= (unsigned int)sample->length) &&
			((unsigned int)sample->loop_start < (unsigned int)sample->loop_end))
		{
			sample->length = sample->loop_end;
			sample->flags |= IT_SAMPLE_LOOP;
			if ( flags & 0x10 ) sample->flags |= IT_SAMPLE_PINGPONG_LOOP;
		}
	}

	length_bytes = sample->length << ( ( flags & 0x04 ) >> 2 );

	sample->data = malloc( length_bytes );
	if ( ! sample->data )
		return -1;

    if ( dumbfile_seek( f, start + header_length, DFS_SEEK_SET ) )
        return -1;

    dumbfile_getnc( sample->data, length_bytes, f );

	return 0;
}